

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZHelp.cpp
# Opt level: O0

string * CZHelp::rtrim_copy(string *s)

{
  string *in_RSI;
  string *in_RDI;
  string *in_stack_00000020;
  
  rtrim(in_stack_00000020);
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string CZHelp::rtrim_copy(std::string s) {
    rtrim(s);
    return s;
}